

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O1

void spki_table_free_without_notify(spki_table *spki_table)

{
  pthread_rwlock_t *__rwlock;
  long lVar1;
  tommy_node_struct *ptVar2;
  tommy_list ptVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __rwlock = &spki_table->lock;
  pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  spki_table->update_fp = (spki_update_fp)0x0;
  ptVar3 = spki_table->list;
  while (ptVar3 != (tommy_list)0x0) {
    ptVar2 = ptVar3->next;
    free(ptVar3->data);
    ptVar3 = ptVar2;
  }
  tommy_hashlin_done(&spki_table->hashtable);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pthread_rwlock_destroy((pthread_rwlock_t *)__rwlock);
  return;
}

Assistant:

void spki_table_free_without_notify(struct spki_table *spki_table)
{
	pthread_rwlock_wrlock(&spki_table->lock);

	spki_table->update_fp = NULL;
	tommy_list_foreach(&spki_table->list, free);
	tommy_hashlin_done(&spki_table->hashtable);

	pthread_rwlock_unlock(&spki_table->lock);
	pthread_rwlock_destroy(&spki_table->lock);
}